

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quest.cpp
# Opt level: O0

bool __thiscall Quest_Context::DoAction(Quest_Context *this,Action *action)

{
  byte bVar1;
  World *pWVar2;
  Character *pCVar3;
  bool bVar4;
  short id_00;
  int iVar5;
  int iVar6;
  int iVar7;
  pointer ppVar8;
  mapped_type *this_00;
  element_type *peVar9;
  element_type *this_01;
  vector<Map_*,_std::allocator<Map_*>_> *this_02;
  reference ppMVar10;
  mapped_type *pmVar11;
  int *piVar12;
  reference pvVar13;
  list<Character_*,_std::allocator<Character_*>_> *this_03;
  reference ppCVar14;
  size_type sVar15;
  Runtime_Error *pRVar16;
  const_reference pvVar17;
  mapped_type *pmVar18;
  int local_a88;
  int local_a78;
  uint local_a60;
  allocator<char> local_809;
  key_type local_808;
  undefined1 local_7e1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7e0;
  anon_class_4_1_a8c68091 local_7bc;
  function<int_(int)> local_7b8;
  string local_798;
  int local_774;
  undefined1 local_770 [4];
  int value_2;
  string stat_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_748;
  anon_class_4_1_a8c68091 local_724;
  function<int_(int)> local_720;
  string local_700;
  int local_6dc;
  undefined1 local_6d8 [4];
  int value_1;
  string stat_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6b0;
  anon_class_4_1_a8c68091 local_68c;
  function<int_(int)> local_688;
  string local_668;
  int local_644;
  undefined1 local_640 [4];
  int value;
  string stat;
  string local_600;
  string local_5e0;
  string local_5c0;
  undefined1 local_5a0 [8];
  PacketBuilder builder_7;
  PacketBuilder builder_6;
  PacketBuilder builder_5;
  PacketBuilder builder_4;
  int amount_1;
  int id_4;
  PacketBuilder builder_3;
  PacketBuilder builder_2;
  int amount;
  int id_3;
  PacketBuilder builder_1;
  Character *character;
  iterator __end15;
  iterator __begin15;
  list<Character_*,_std::allocator<Character_*>_> *__range15;
  PacketBuilder builder;
  key_type local_3e8;
  allocator<char> local_3c1;
  key_type local_3c0;
  allocator<char> local_399;
  key_type local_398;
  allocator<char> local_371;
  key_type local_370;
  int local_350;
  byte local_349;
  Map *pMStack_348;
  bool level_up;
  Map *map;
  iterator __end11;
  iterator __begin11;
  vector<Map_*,_std::allocator<Map_*>_> *__range11;
  int local_320;
  int local_31c;
  int local_318;
  int strength_1;
  int local_310;
  int local_30c;
  undefined1 local_308 [4];
  int strength;
  undefined1 local_2e8 [24];
  Quest_Context *quest_1;
  string state_1;
  undefined1 local_2a8 [2];
  short id_2;
  short this_id_1;
  _Self local_288;
  allocator<char> local_279;
  key_type local_278;
  _Self local_258;
  undefined1 local_250 [8];
  shared_ptr<Quest_Context> context_2;
  undefined1 local_238 [2];
  short id_1;
  short this_id;
  string local_218;
  byte local_1f2;
  allocator<char> local_1f1;
  string local_1f0;
  undefined1 local_1d0 [8];
  shared_ptr<Quest_Context> context_1;
  Quest *quest;
  _Self local_1b0;
  iterator it;
  shared_ptr<Quest_Context> context;
  undefined1 local_190 [4];
  short id;
  allocator<char> local_169;
  string local_168;
  allocator<char> local_141;
  key_type local_140;
  allocator<char> local_119;
  key_type local_118;
  allocator<char> local_f1;
  string local_f0;
  _Self local_d0;
  allocator<char> local_c1;
  key_type local_c0;
  _Self local_a0;
  uint local_94;
  string local_90;
  undefined1 local_70 [8];
  string state;
  undefined1 local_40 [8];
  string function_name;
  Action *action_local;
  Quest_Context *this_local;
  
  function_name.field_2._8_8_ = action;
  bVar4 = Quest::Disabled(this->quest);
  if (bVar4) {
    this_local._7_1_ = 0;
    goto LAB_0020c15f;
  }
  std::__cxx11::string::string((string *)local_40,(string *)(function_name.field_2._8_8_ + 0x118));
  bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_40,"setstate");
  if (bVar4) {
    pvVar17 = std::deque<util::variant,_std::allocator<util::variant>_>::operator[]
                        ((deque<util::variant,_std::allocator<util::variant>_> *)
                         (function_name.field_2._8_8_ + 0x138),0);
    util::variant::operator_cast_to_string(&local_90,pvVar17);
    util::lowercase((string *)local_70,&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    EOPlus::Context::SetState(&this->super_Context,(string *)local_70,true);
    this_local._7_1_ = 1;
    local_94 = 1;
    std::__cxx11::string::~string((string *)local_70);
  }
  else {
    bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_40,"reset");
    if (bVar4) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_c0,"c",&local_c1);
      local_a0._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short>_>_>
           ::find(&this->progress,&local_c0);
      local_d0._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short>_>_>
           ::end(&this->progress);
      bVar4 = std::operator==(&local_a0,&local_d0);
      std::__cxx11::string::~string((string *)&local_c0);
      std::allocator<char>::~allocator(&local_c1);
      if (bVar4) {
        pCVar3 = this->character;
        id_00 = Quest::ID(this->quest);
        Character::ResetQuest(pCVar3,id_00);
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_f0,"done",&local_f1);
        EOPlus::Context::SetState(&this->super_Context,&local_f0,true);
        std::__cxx11::string::~string((string *)&local_f0);
        std::allocator<char>::~allocator(&local_f1);
      }
      this_local._7_1_ = 1;
      local_94 = 1;
    }
    else {
      bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_40,"resetdaily");
      if (bVar4) {
        iVar7 = quest_day();
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_118,"d",&local_119);
        pmVar18 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short>_>_>
                  ::operator[](&this->progress,&local_118);
        *pmVar18 = (mapped_type)iVar7;
        std::__cxx11::string::~string((string *)&local_118);
        std::allocator<char>::~allocator(&local_119);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_140,"c",&local_141);
        pmVar18 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short>_>_>
                  ::operator[](&this->progress,&local_140);
        *pmVar18 = *pmVar18 + 1;
        std::__cxx11::string::~string((string *)&local_140);
        std::allocator<char>::~allocator(&local_141);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_168,"done",&local_169);
        EOPlus::Context::SetState(&this->super_Context,&local_168,true);
        std::__cxx11::string::~string((string *)&local_168);
        std::allocator<char>::~allocator(&local_169);
        this_local._7_1_ = 1;
        local_94 = 1;
      }
      else {
        bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_40,"end");
        if (bVar4) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_190,"end",
                     (allocator<char> *)
                     ((long)&context.super___shared_ptr<Quest_Context,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi + 7));
          EOPlus::Context::SetState(&this->super_Context,(string *)local_190,true);
          std::__cxx11::string::~string((string *)local_190);
          std::allocator<char>::~allocator
                    ((allocator<char> *)
                     ((long)&context.super___shared_ptr<Quest_Context,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi + 7));
          this_local._7_1_ = 1;
          local_94 = 1;
        }
        else {
          bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_40,"startquest");
          if (bVar4) {
            pvVar17 = std::deque<util::variant,_std::allocator<util::variant>_>::operator[]
                                ((deque<util::variant,_std::allocator<util::variant>_> *)
                                 (function_name.field_2._8_8_ + 0x138),0);
            iVar7 = util::variant::operator_cast_to_int(pvVar17);
            context.super___shared_ptr<Quest_Context,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
            _4_2_ = (undefined2)iVar7;
            Character::GetQuest((Character *)&it,(short)this->character);
            bVar4 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&it);
            if (bVar4) {
              peVar9 = std::
                       __shared_ptr_access<Quest_Context,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<Quest_Context,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)&it);
              EOPlus::Context::StateName_abi_cxx11_(&local_218,&peVar9->super_Context);
              bVar4 = std::operator==(&local_218,"done");
              std::__cxx11::string::~string((string *)&local_218);
              if (bVar4) {
                peVar9 = std::
                         __shared_ptr_access<Quest_Context,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         ::operator->((__shared_ptr_access<Quest_Context,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                       *)&it);
                sVar15 = std::deque<util::variant,_std::allocator<util::variant>_>::size
                                   ((deque<util::variant,_std::allocator<util::variant>_> *)
                                    (function_name.field_2._8_8_ + 0x138));
                context_2.super___shared_ptr<Quest_Context,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi._6_1_ = 0;
                if (sVar15 < 2) {
                  std::allocator<char>::allocator();
                  context_2.super___shared_ptr<Quest_Context,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi._6_1_ = 1;
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)local_238,"begin",
                             (allocator<char> *)
                             ((long)&context_2.
                                     super___shared_ptr<Quest_Context,_(__gnu_cxx::_Lock_policy)2>.
                                     _M_refcount._M_pi + 7));
                }
                else {
                  pvVar17 = std::deque<util::variant,_std::allocator<util::variant>_>::operator[]
                                      ((deque<util::variant,_std::allocator<util::variant>_> *)
                                       (function_name.field_2._8_8_ + 0x138),1);
                  util::variant::operator_cast_to_string((string *)local_238,pvVar17);
                }
                EOPlus::Context::SetState(&peVar9->super_Context,(string *)local_238,true);
                std::__cxx11::string::~string((string *)local_238);
                if ((context_2.super___shared_ptr<Quest_Context,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi._6_1_ & 1) != 0) {
                  std::allocator<char>::~allocator
                            ((allocator<char> *)
                             ((long)&context_2.
                                     super___shared_ptr<Quest_Context,_(__gnu_cxx::_Lock_policy)2>.
                                     _M_refcount._M_pi + 7));
                }
              }
            }
            else {
              local_1b0._M_node =
                   (_Base_ptr)
                   std::
                   map<short,_std::shared_ptr<Quest>,_std::less<short>,_std::allocator<std::pair<const_short,_std::shared_ptr<Quest>_>_>_>
                   ::find(&this->character->world->quests,
                          (key_type *)
                          ((long)&context.
                                  super___shared_ptr<Quest_Context,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_refcount._M_pi + 4));
              quest = (Quest *)std::
                               map<short,_std::shared_ptr<Quest>,_std::less<short>,_std::allocator<std::pair<const_short,_std::shared_ptr<Quest>_>_>_>
                               ::end(&this->character->world->quests);
              bVar4 = std::operator!=(&local_1b0,(_Self *)&quest);
              if (bVar4) {
                ppVar8 = std::_Rb_tree_iterator<std::pair<const_short,_std::shared_ptr<Quest>_>_>::
                         operator->(&local_1b0);
                context_1.super___shared_ptr<Quest_Context,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                        std::__shared_ptr<Quest,_(__gnu_cxx::_Lock_policy)2>::get
                                  (&(ppVar8->second).
                                    super___shared_ptr<Quest,_(__gnu_cxx::_Lock_policy)2>);
                std::make_shared<Quest_Context,Character*&,Quest*&>
                          ((Character **)local_1d0,(Quest **)&this->character);
                pCVar3 = this->character;
                ppVar8 = std::_Rb_tree_iterator<std::pair<const_short,_std::shared_ptr<Quest>_>_>::
                         operator->(&local_1b0);
                this_00 = std::
                          map<short,_std::shared_ptr<Quest_Context>,_std::less<short>,_std::allocator<std::pair<const_short,_std::shared_ptr<Quest_Context>_>_>_>
                          ::operator[](&pCVar3->quests,&ppVar8->first);
                std::shared_ptr<Quest_Context>::operator=
                          (this_00,(shared_ptr<Quest_Context> *)local_1d0);
                peVar9 = std::
                         __shared_ptr_access<Quest_Context,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         ::operator->((__shared_ptr_access<Quest_Context,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                       *)local_1d0);
                sVar15 = std::deque<util::variant,_std::allocator<util::variant>_>::size
                                   ((deque<util::variant,_std::allocator<util::variant>_> *)
                                    (function_name.field_2._8_8_ + 0x138));
                local_1f2 = 0;
                if (sVar15 < 2) {
                  std::allocator<char>::allocator();
                  local_1f2 = 1;
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_1f0,"begin",&local_1f1);
                }
                else {
                  pvVar17 = std::deque<util::variant,_std::allocator<util::variant>_>::operator[]
                                      ((deque<util::variant,_std::allocator<util::variant>_> *)
                                       (function_name.field_2._8_8_ + 0x138),1);
                  util::variant::operator_cast_to_string(&local_1f0,pvVar17);
                }
                EOPlus::Context::SetState(&peVar9->super_Context,&local_1f0,true);
                std::__cxx11::string::~string((string *)&local_1f0);
                if ((local_1f2 & 1) != 0) {
                  std::allocator<char>::~allocator(&local_1f1);
                }
                std::shared_ptr<Quest_Context>::~shared_ptr((shared_ptr<Quest_Context> *)local_1d0);
              }
            }
            std::shared_ptr<Quest_Context>::~shared_ptr((shared_ptr<Quest_Context> *)&it);
          }
          else {
            bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_40,"resetquest");
            if (bVar4) {
              context_2.super___shared_ptr<Quest_Context,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi._4_2_ = Quest::ID(this->quest);
              pvVar17 = std::deque<util::variant,_std::allocator<util::variant>_>::operator[]
                                  ((deque<util::variant,_std::allocator<util::variant>_> *)
                                   (function_name.field_2._8_8_ + 0x138),0);
              iVar7 = util::variant::operator_cast_to_int(pvVar17);
              context_2.super___shared_ptr<Quest_Context,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi._2_2_ = (short)iVar7;
              Character::GetQuest((Character *)local_250,(short)this->character);
              bVar4 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_250);
              if (bVar4) {
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_278,"c",&local_279);
                local_258._M_node =
                     (_Base_ptr)
                     std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short>_>_>
                     ::find(&this->progress,&local_278);
                local_288._M_node =
                     (_Base_ptr)
                     std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short>_>_>
                     ::end(&this->progress);
                bVar4 = std::operator==(&local_258,&local_288);
                std::__cxx11::string::~string((string *)&local_278);
                std::allocator<char>::~allocator(&local_279);
                if (bVar4) {
                  peVar9 = std::
                           __shared_ptr_access<Quest_Context,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           ::operator->((__shared_ptr_access<Quest_Context,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                         *)local_250);
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)local_2a8,"done",
                             (allocator<char> *)(state_1.field_2._M_local_buf + 0xf));
                  EOPlus::Context::SetState(&peVar9->super_Context,(string *)local_2a8,true);
                  std::__cxx11::string::~string((string *)local_2a8);
                  std::allocator<char>::~allocator
                            ((allocator<char> *)(state_1.field_2._M_local_buf + 0xf));
                }
                else {
                  Character::ResetQuest
                            (this->character,
                             context_2.super___shared_ptr<Quest_Context,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount._M_pi._2_2_);
                }
              }
              if (context_2.super___shared_ptr<Quest_Context,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi._2_2_ ==
                  context_2.super___shared_ptr<Quest_Context,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi._4_2_) {
                this_local._7_1_ = 1;
              }
              local_94 = (uint)(context_2.
                                super___shared_ptr<Quest_Context,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount._M_pi._2_2_ ==
                               context_2.
                               super___shared_ptr<Quest_Context,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount._M_pi._4_2_);
              std::shared_ptr<Quest_Context>::~shared_ptr((shared_ptr<Quest_Context> *)local_250);
            }
            else {
              bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_40,"setqueststate");
              if (!bVar4) {
                bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)local_40,"showhint");
                if (bVar4) {
                  pCVar3 = this->character;
                  pvVar17 = std::deque<util::variant,_std::allocator<util::variant>_>::operator[]
                                      ((deque<util::variant,_std::allocator<util::variant>_> *)
                                       (function_name.field_2._8_8_ + 0x138),0);
                  util::variant::operator_cast_to_string((string *)local_308,pvVar17);
                  (*(pCVar3->super_Command_Source)._vptr_Command_Source[6])(pCVar3,local_308);
                  std::__cxx11::string::~string((string *)local_308);
                }
                else {
                  bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)local_40,"quake");
                  if (bVar4) {
                    local_30c = 5;
                    sVar15 = std::deque<util::variant,_std::allocator<util::variant>_>::size
                                       ((deque<util::variant,_std::allocator<util::variant>_> *)
                                        (function_name.field_2._8_8_ + 0x138));
                    if (sVar15 != 0) {
                      local_310 = 1;
                      strength_1 = 8;
                      pvVar17 = std::deque<util::variant,_std::allocator<util::variant>_>::
                                operator[]((deque<util::variant,_std::allocator<util::variant>_> *)
                                           (function_name.field_2._8_8_ + 0x138),0);
                      local_318 = util::variant::operator_cast_to_int(pvVar17);
                      piVar12 = std::min<int>(&strength_1,&local_318);
                      piVar12 = std::max<int>(&local_310,piVar12);
                      local_30c = *piVar12;
                    }
                    Map::Effect(this->character->map,MAP_EFFECT_QUAKE,(uchar)local_30c);
                  }
                  else {
                    bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)local_40,"quakeworld");
                    if (bVar4) {
                      local_31c = 5;
                      sVar15 = std::deque<util::variant,_std::allocator<util::variant>_>::size
                                         ((deque<util::variant,_std::allocator<util::variant>_> *)
                                          (function_name.field_2._8_8_ + 0x138));
                      if (sVar15 != 0) {
                        local_320 = 1;
                        __range11._4_4_ = 8;
                        pvVar17 = std::deque<util::variant,_std::allocator<util::variant>_>::
                                  operator[]((deque<util::variant,_std::allocator<util::variant>_> *
                                             )(function_name.field_2._8_8_ + 0x138),0);
                        __range11._0_4_ = util::variant::operator_cast_to_int(pvVar17);
                        piVar12 = std::min<int>((int *)((long)&__range11 + 4),(int *)&__range11);
                        piVar12 = std::max<int>(&local_320,piVar12);
                        local_31c = *piVar12;
                      }
                      this_02 = &this->character->world->maps;
                      __end11 = std::vector<Map_*,_std::allocator<Map_*>_>::begin(this_02);
                      map = (Map *)std::vector<Map_*,_std::allocator<Map_*>_>::end(this_02);
                      while (bVar4 = __gnu_cxx::operator!=
                                               (&__end11,(
                                                  __normal_iterator<Map_**,_std::vector<Map_*,_std::allocator<Map_*>_>_>
                                                  *)&map), bVar4) {
                        ppMVar10 = __gnu_cxx::
                                   __normal_iterator<Map_**,_std::vector<Map_*,_std::allocator<Map_*>_>_>
                                   ::operator*(&__end11);
                        pMStack_348 = *ppMVar10;
                        if ((pMStack_348->exists & 1U) != 0) {
                          Map::Effect(pMStack_348,MAP_EFFECT_QUAKE,(uchar)local_31c);
                        }
                        __gnu_cxx::
                        __normal_iterator<Map_**,_std::vector<Map_*,_std::allocator<Map_*>_>_>::
                        operator++(&__end11);
                      }
                    }
                    else {
                      bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)local_40,"setmap");
                      if ((bVar4) ||
                         (bVar4 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_40,"setcoord"), bVar4)) {
                        pCVar3 = this->character;
                        pvVar17 = std::deque<util::variant,_std::allocator<util::variant>_>::
                                  operator[]((deque<util::variant,_std::allocator<util::variant>_> *
                                             )(function_name.field_2._8_8_ + 0x138),0);
                        iVar7 = util::variant::operator_cast_to_int(pvVar17);
                        pvVar17 = std::deque<util::variant,_std::allocator<util::variant>_>::
                                  operator[]((deque<util::variant,_std::allocator<util::variant>_> *
                                             )(function_name.field_2._8_8_ + 0x138),1);
                        iVar5 = util::variant::operator_cast_to_int(pvVar17);
                        pvVar17 = std::deque<util::variant,_std::allocator<util::variant>_>::
                                  operator[]((deque<util::variant,_std::allocator<util::variant>_> *
                                             )(function_name.field_2._8_8_ + 0x138),2);
                        iVar6 = util::variant::operator_cast_to_int(pvVar17);
                        Character::Warp(pCVar3,(short)iVar7,(uchar)iVar5,(uchar)iVar6,
                                        WARP_ANIMATION_NONE);
                      }
                      else {
                        bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                 *)local_40,"playsound");
                        if (bVar4) {
                          pCVar3 = this->character;
                          pvVar17 = std::deque<util::variant,_std::allocator<util::variant>_>::
                                    operator[]((deque<util::variant,_std::allocator<util::variant>_>
                                                *)(function_name.field_2._8_8_ + 0x138),0);
                          iVar7 = util::variant::operator_cast_to_int(pvVar17);
                          Character::PlaySound(pCVar3,(uchar)iVar7);
                        }
                        else {
                          bVar4 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_40,"giveexp");
                          if (bVar4) {
                            local_349 = 0;
                            pvVar17 = std::deque<util::variant,_std::allocator<util::variant>_>::
                                      operator[]((deque<util::variant,_std::allocator<util::variant>_>
                                                  *)(function_name.field_2._8_8_ + 0x138),0);
                            iVar7 = util::variant::operator_cast_to_int(pvVar17);
                            this->character->exp = this->character->exp + iVar7;
                            pCVar3 = this->character;
                            pWVar2 = pCVar3->map->world;
                            std::allocator<char>::allocator();
                            std::__cxx11::string::string<std::allocator<char>>
                                      ((string *)&local_370,"MaxExp",&local_371);
                            pmVar11 = std::
                                      unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                                      ::operator[](&(pWVar2->config).
                                                                                                        
                                                  super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                                                  ,&local_370);
                            local_350 = util::variant::operator_cast_to_int(pmVar11);
                            piVar12 = std::min<int>(&pCVar3->exp,&local_350);
                            this->character->exp = *piVar12;
                            std::__cxx11::string::~string((string *)&local_370);
                            std::allocator<char>::~allocator(&local_371);
                            while( true ) {
                              bVar1 = this->character->level;
                              pWVar2 = this->character->map->world;
                              std::allocator<char>::allocator();
                              std::__cxx11::string::string<std::allocator<char>>
                                        ((string *)&local_398,"MaxLevel",&local_399);
                              pmVar11 = std::
                                        unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                                        ::operator[](&(pWVar2->config).
                                                                                                            
                                                  super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                                                  ,&local_398);
                              iVar7 = util::variant::operator_cast_to_int(pmVar11);
                              bVar4 = false;
                              if ((int)(uint)bVar1 < iVar7) {
                                iVar7 = this->character->exp;
                                pvVar13 = std::array<int,_254UL>::operator[]
                                                    (&this->character->map->world->exp_table,
                                                     (long)(int)(this->character->level + 1));
                                bVar4 = *pvVar13 <= iVar7;
                              }
                              std::__cxx11::string::~string((string *)&local_398);
                              std::allocator<char>::~allocator(&local_399);
                              if (!bVar4) break;
                              local_349 = 1;
                              this->character->level = this->character->level + '\x01';
                              pWVar2 = this->character->map->world;
                              std::allocator<char>::allocator();
                              std::__cxx11::string::string<std::allocator<char>>
                                        ((string *)&local_3c0,"StatPerLevel",&local_3c1);
                              pmVar11 = std::
                                        unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                                        ::operator[](&(pWVar2->config).
                                                                                                            
                                                  super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                                                  ,&local_3c0);
                              iVar7 = util::variant::operator_cast_to_int(pmVar11);
                              this->character->statpoints = this->character->statpoints + iVar7;
                              std::__cxx11::string::~string((string *)&local_3c0);
                              std::allocator<char>::~allocator(&local_3c1);
                              pWVar2 = this->character->map->world;
                              std::allocator<char>::allocator();
                              std::__cxx11::string::string<std::allocator<char>>
                                        ((string *)&local_3e8,"SkillPerLevel",
                                         (allocator<char> *)((long)&builder.add_size + 7));
                              pmVar11 = std::
                                        unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                                        ::operator[](&(pWVar2->config).
                                                                                                            
                                                  super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                                                  ,&local_3e8);
                              iVar7 = util::variant::operator_cast_to_int(pmVar11);
                              this->character->skillpoints = this->character->skillpoints + iVar7;
                              std::__cxx11::string::~string((string *)&local_3e8);
                              std::allocator<char>::~allocator
                                        ((allocator<char> *)((long)&builder.add_size + 7));
                              Character::CalculateStats(this->character,true);
                            }
                            PacketBuilder::PacketBuilder
                                      ((PacketBuilder *)&__range15,PACKET_RECOVER,PACKET_REPLY,0xb);
                            PacketBuilder::AddInt((PacketBuilder *)&__range15,this->character->exp);
                            PacketBuilder::AddShort
                                      ((PacketBuilder *)&__range15,this->character->karma);
                            if ((local_349 & 1) == 0) {
                              local_a60 = 0;
                            }
                            else {
                              local_a60 = (uint)this->character->level;
                            }
                            PacketBuilder::AddChar((PacketBuilder *)&__range15,local_a60);
                            if ((local_349 & 1) != 0) {
                              PacketBuilder::AddShort
                                        ((PacketBuilder *)&__range15,this->character->statpoints);
                              PacketBuilder::AddShort
                                        ((PacketBuilder *)&__range15,this->character->skillpoints);
                            }
                            Character::Send(this->character,(PacketBuilder *)&__range15);
                            if ((local_349 & 1) != 0) {
                              this_03 = &this->character->map->characters;
                              __end15 = std::__cxx11::
                                        list<Character_*,_std::allocator<Character_*>_>::begin
                                                  (this_03);
                              character = (Character *)
                                          std::__cxx11::
                                          list<Character_*,_std::allocator<Character_*>_>::end
                                                    (this_03);
                              while (bVar4 = std::operator!=(&__end15,(_Self *)&character), bVar4) {
                                ppCVar14 = std::_List_iterator<Character_*>::operator*(&__end15);
                                builder_1.add_size = (size_t)*ppCVar14;
                                if (((Character *)builder_1.add_size != this->character) &&
                                   (bVar4 = Character::InRange(this->character,
                                                               (Character *)builder_1.add_size),
                                   bVar4)) {
                                  PacketBuilder::PacketBuilder
                                            ((PacketBuilder *)&amount,PACKET_ITEM,PACKET_ACCEPT,2);
                                  iVar7 = Character::PlayerID((Character *)builder_1.add_size);
                                  PacketBuilder::AddShort((PacketBuilder *)&amount,iVar7);
                                  Character::Send((Character *)builder_1.add_size,
                                                  (PacketBuilder *)&amount);
                                  PacketBuilder::~PacketBuilder((PacketBuilder *)&amount);
                                }
                                std::_List_iterator<Character_*>::operator++(&__end15);
                              }
                            }
                            PacketBuilder::~PacketBuilder((PacketBuilder *)&__range15);
                          }
                          else {
                            bVar4 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_40,"giveitem");
                            if (bVar4) {
                              pvVar17 = std::deque<util::variant,_std::allocator<util::variant>_>::
                                        operator[]((
                                                  deque<util::variant,_std::allocator<util::variant>_>
                                                  *)(function_name.field_2._8_8_ + 0x138),0);
                              iVar7 = util::variant::operator_cast_to_int(pvVar17);
                              sVar15 = std::deque<util::variant,_std::allocator<util::variant>_>::
                                       size((deque<util::variant,_std::allocator<util::variant>_> *)
                                            (function_name.field_2._8_8_ + 0x138));
                              if (sVar15 < 2) {
                                local_a78 = 1;
                              }
                              else {
                                pvVar17 = std::deque<util::variant,_std::allocator<util::variant>_>
                                          ::operator[]((
                                                  deque<util::variant,_std::allocator<util::variant>_>
                                                  *)(function_name.field_2._8_8_ + 0x138),1);
                                local_a78 = util::variant::operator_cast_to_int(pvVar17);
                              }
                              builder_2.add_size._4_2_ = (short)iVar7;
                              bVar4 = Character::AddItem(this->character,builder_2.add_size._4_2_,
                                                         local_a78);
                              if (bVar4) {
                                if (iVar7 == 1) {
                                  PacketBuilder::PacketBuilder
                                            ((PacketBuilder *)&builder_3.add_size,PACKET_ITEM,
                                             PACKET_GET,9);
                                  PacketBuilder::AddShort((PacketBuilder *)&builder_3.add_size,0);
                                  PacketBuilder::AddShort((PacketBuilder *)&builder_3.add_size,1);
                                  PacketBuilder::AddThree
                                            ((PacketBuilder *)&builder_3.add_size,local_a78);
                                  PacketBuilder::AddChar
                                            ((PacketBuilder *)&builder_3.add_size,
                                             this->character->weight);
                                  PacketBuilder::AddChar
                                            ((PacketBuilder *)&builder_3.add_size,
                                             this->character->maxweight);
                                  Character::Send(this->character,
                                                  (PacketBuilder *)&builder_3.add_size);
                                  PacketBuilder::~PacketBuilder
                                            ((PacketBuilder *)&builder_3.add_size);
                                }
                                else {
                                  PacketBuilder::PacketBuilder
                                            ((PacketBuilder *)&amount_1,PACKET_ITEM,PACKET_OBTAIN,6)
                                  ;
                                  PacketBuilder::AddShort((PacketBuilder *)&amount_1,iVar7);
                                  PacketBuilder::AddThree((PacketBuilder *)&amount_1,local_a78);
                                  PacketBuilder::AddChar
                                            ((PacketBuilder *)&amount_1,this->character->weight);
                                  Character::Send(this->character,(PacketBuilder *)&amount_1);
                                  PacketBuilder::~PacketBuilder((PacketBuilder *)&amount_1);
                                }
                              }
                            }
                            else {
                              bVar4 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_40,"removeitem");
                              if (bVar4) {
                                pvVar17 = std::deque<util::variant,_std::allocator<util::variant>_>
                                          ::operator[]((
                                                  deque<util::variant,_std::allocator<util::variant>_>
                                                  *)(function_name.field_2._8_8_ + 0x138),0);
                                iVar7 = util::variant::operator_cast_to_int(pvVar17);
                                sVar15 = std::deque<util::variant,_std::allocator<util::variant>_>::
                                         size((deque<util::variant,_std::allocator<util::variant>_>
                                               *)(function_name.field_2._8_8_ + 0x138));
                                if (sVar15 < 2) {
                                  local_a88 = 1;
                                }
                                else {
                                  pvVar17 = std::
                                            deque<util::variant,_std::allocator<util::variant>_>::
                                            operator[]((
                                                  deque<util::variant,_std::allocator<util::variant>_>
                                                  *)(function_name.field_2._8_8_ + 0x138),1);
                                  local_a88 = util::variant::operator_cast_to_int(pvVar17);
                                }
                                builder_4.add_size._4_2_ = (short)iVar7;
                                bVar4 = Character::DelItem(this->character,builder_4.add_size._4_2_,
                                                           local_a88);
                                if (bVar4) {
                                  PacketBuilder::PacketBuilder
                                            ((PacketBuilder *)&builder_5.add_size,PACKET_ITEM,
                                             PACKET_KICK,7);
                                  PacketBuilder::AddShort
                                            ((PacketBuilder *)&builder_5.add_size,iVar7);
                                  iVar7 = Character::HasItem(this->character,
                                                             builder_4.add_size._4_2_,false);
                                  PacketBuilder::AddInt((PacketBuilder *)&builder_5.add_size,iVar7);
                                  PacketBuilder::AddChar
                                            ((PacketBuilder *)&builder_5.add_size,
                                             this->character->weight);
                                  Character::Send(this->character,
                                                  (PacketBuilder *)&builder_5.add_size);
                                  PacketBuilder::~PacketBuilder
                                            ((PacketBuilder *)&builder_5.add_size);
                                }
                              }
                              else {
                                bVar4 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_40,"setclass");
                                if (bVar4) {
                                  pvVar17 = std::
                                            deque<util::variant,_std::allocator<util::variant>_>::
                                            operator[]((
                                                  deque<util::variant,_std::allocator<util::variant>_>
                                                  *)(function_name.field_2._8_8_ + 0x138),0);
                                  iVar7 = util::variant::operator_cast_to_int(pvVar17);
                                  this->character->clas = (uchar)iVar7;
                                  Character::CalculateStats(this->character,true);
                                  PacketBuilder::PacketBuilder
                                            ((PacketBuilder *)&builder_6.add_size,PACKET_RECOVER,
                                             PACKET_LIST,0x20);
                                  PacketBuilder::AddShort
                                            ((PacketBuilder *)&builder_6.add_size,
                                             (uint)this->character->clas);
                                  PacketBuilder::AddShort
                                            ((PacketBuilder *)&builder_6.add_size,
                                             *this->character->display_str);
                                  PacketBuilder::AddShort
                                            ((PacketBuilder *)&builder_6.add_size,
                                             *this->character->display_intl);
                                  PacketBuilder::AddShort
                                            ((PacketBuilder *)&builder_6.add_size,
                                             *this->character->display_wis);
                                  PacketBuilder::AddShort
                                            ((PacketBuilder *)&builder_6.add_size,
                                             *this->character->display_agi);
                                  PacketBuilder::AddShort
                                            ((PacketBuilder *)&builder_6.add_size,
                                             *this->character->display_con);
                                  PacketBuilder::AddShort
                                            ((PacketBuilder *)&builder_6.add_size,
                                             *this->character->display_cha);
                                  PacketBuilder::AddShort
                                            ((PacketBuilder *)&builder_6.add_size,
                                             this->character->maxhp);
                                  PacketBuilder::AddShort
                                            ((PacketBuilder *)&builder_6.add_size,
                                             this->character->maxtp);
                                  PacketBuilder::AddShort
                                            ((PacketBuilder *)&builder_6.add_size,
                                             this->character->maxsp);
                                  PacketBuilder::AddShort
                                            ((PacketBuilder *)&builder_6.add_size,
                                             this->character->maxweight);
                                  PacketBuilder::AddShort
                                            ((PacketBuilder *)&builder_6.add_size,
                                             this->character->mindam);
                                  PacketBuilder::AddShort
                                            ((PacketBuilder *)&builder_6.add_size,
                                             this->character->maxdam);
                                  PacketBuilder::AddShort
                                            ((PacketBuilder *)&builder_6.add_size,
                                             this->character->accuracy);
                                  PacketBuilder::AddShort
                                            ((PacketBuilder *)&builder_6.add_size,
                                             this->character->evade);
                                  PacketBuilder::AddShort
                                            ((PacketBuilder *)&builder_6.add_size,
                                             this->character->armor);
                                  Character::Send(this->character,
                                                  (PacketBuilder *)&builder_6.add_size);
                                  PacketBuilder::~PacketBuilder
                                            ((PacketBuilder *)&builder_6.add_size);
                                }
                                else {
                                  bVar4 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_40,"setrace");
                                  if (bVar4) {
                                    pvVar17 = std::
                                              deque<util::variant,_std::allocator<util::variant>_>::
                                              operator[]((
                                                  deque<util::variant,_std::allocator<util::variant>_>
                                                  *)(function_name.field_2._8_8_ + 0x138),0);
                                    iVar7 = util::variant::operator_cast_to_int(pvVar17);
                                    this->character->race = (Skin)iVar7;
                                    pCVar3 = this->character;
                                    Character::Warp(pCVar3,pCVar3->map->id,pCVar3->x,pCVar3->y,
                                                    WARP_ANIMATION_NONE);
                                  }
                                  else {
                                    bVar4 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_40,"removekarma");
                                    if (bVar4) {
                                      pvVar17 = std::
                                                deque<util::variant,_std::allocator<util::variant>_>
                                                ::operator[]((
                                                  deque<util::variant,_std::allocator<util::variant>_>
                                                  *)(function_name.field_2._8_8_ + 0x138),0);
                                      iVar7 = util::variant::operator_cast_to_int(pvVar17);
                                      this->character->karma = this->character->karma - iVar7;
                                      if (this->character->karma < 0) {
                                        this->character->karma = 0;
                                      }
                                      PacketBuilder::PacketBuilder
                                                ((PacketBuilder *)&builder_7.add_size,PACKET_RECOVER
                                                 ,PACKET_REPLY,7);
                                      PacketBuilder::AddInt
                                                ((PacketBuilder *)&builder_7.add_size,
                                                 this->character->exp);
                                      PacketBuilder::AddShort
                                                ((PacketBuilder *)&builder_7.add_size,
                                                 this->character->karma);
                                      PacketBuilder::AddChar((PacketBuilder *)&builder_7.add_size,0)
                                      ;
                                      Character::Send(this->character,
                                                      (PacketBuilder *)&builder_7.add_size);
                                      PacketBuilder::~PacketBuilder
                                                ((PacketBuilder *)&builder_7.add_size);
                                    }
                                    else {
                                      bVar4 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_40,"givekarma");
                                      if (bVar4) {
                                        pvVar17 = std::
                                                  deque<util::variant,_std::allocator<util::variant>_>
                                                  ::operator[]((
                                                  deque<util::variant,_std::allocator<util::variant>_>
                                                  *)(function_name.field_2._8_8_ + 0x138),0);
                                        iVar7 = util::variant::operator_cast_to_int(pvVar17);
                                        this->character->karma = iVar7 + this->character->karma;
                                        if (2000 < this->character->karma) {
                                          this->character->karma = 2000;
                                        }
                                        PacketBuilder::PacketBuilder
                                                  ((PacketBuilder *)local_5a0,PACKET_RECOVER,
                                                   PACKET_REPLY,7);
                                        PacketBuilder::AddInt
                                                  ((PacketBuilder *)local_5a0,this->character->exp);
                                        PacketBuilder::AddShort
                                                  ((PacketBuilder *)local_5a0,this->character->karma
                                                  );
                                        PacketBuilder::AddChar((PacketBuilder *)local_5a0,0);
                                        Character::Send(this->character,(PacketBuilder *)local_5a0);
                                        PacketBuilder::~PacketBuilder((PacketBuilder *)local_5a0);
                                      }
                                      else {
                                        bVar4 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_40,"settitle");
                                        if (bVar4) {
                                          pvVar17 = std::
                                                  deque<util::variant,_std::allocator<util::variant>_>
                                                  ::operator[]((
                                                  deque<util::variant,_std::allocator<util::variant>_>
                                                  *)(function_name.field_2._8_8_ + 0x138),0);
                                          util::variant::operator_cast_to_string(&local_5c0,pvVar17)
                                          ;
                                          std::__cxx11::string::operator=
                                                    ((string *)&this->character->title,
                                                     (string *)&local_5c0);
                                          std::__cxx11::string::~string((string *)&local_5c0);
                                        }
                                        else {
                                          bVar4 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_40,"setfiance");
                                          if (bVar4) {
                                            pvVar17 = std::
                                                  deque<util::variant,_std::allocator<util::variant>_>
                                                  ::operator[]((
                                                  deque<util::variant,_std::allocator<util::variant>_>
                                                  *)(function_name.field_2._8_8_ + 0x138),0);
                                            util::variant::operator_cast_to_string
                                                      (&local_5e0,pvVar17);
                                            std::__cxx11::string::operator=
                                                      ((string *)&this->character->fiance,
                                                       (string *)&local_5e0);
                                            std::__cxx11::string::~string((string *)&local_5e0);
                                          }
                                          else {
                                            bVar4 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_40,"setpartner");
                                            if (bVar4) {
                                              pvVar17 = std::
                                                  deque<util::variant,_std::allocator<util::variant>_>
                                                  ::operator[]((
                                                  deque<util::variant,_std::allocator<util::variant>_>
                                                  *)(function_name.field_2._8_8_ + 0x138),0);
                                              util::variant::operator_cast_to_string
                                                        (&local_600,pvVar17);
                                              std::__cxx11::string::operator=
                                                        ((string *)&this->character->partner,
                                                         (string *)&local_600);
                                              std::__cxx11::string::~string((string *)&local_600);
                                            }
                                            else {
                                              bVar4 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_40,"sethome");
                                              if (bVar4) {
                                                pvVar17 = std::
                                                  deque<util::variant,_std::allocator<util::variant>_>
                                                  ::operator[]((
                                                  deque<util::variant,_std::allocator<util::variant>_>
                                                  *)(function_name.field_2._8_8_ + 0x138),0);
                                                util::variant::operator_cast_to_string
                                                          ((string *)((long)&stat.field_2 + 8),
                                                           pvVar17);
                                                std::__cxx11::string::operator=
                                                          ((string *)&this->character->home,
                                                           (string *)(stat.field_2._M_local_buf + 8)
                                                          );
                                                std::__cxx11::string::~string
                                                          ((string *)(stat.field_2._M_local_buf + 8)
                                                          );
                                              }
                                              else {
                                                bVar4 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_40,"setstat");
                                                if (bVar4) {
                                                  pvVar17 = std::
                                                  deque<util::variant,_std::allocator<util::variant>_>
                                                  ::operator[]((
                                                  deque<util::variant,_std::allocator<util::variant>_>
                                                  *)(function_name.field_2._8_8_ + 0x138),0);
                                                  util::variant::operator_cast_to_string
                                                            ((string *)local_640,pvVar17);
                                                  pvVar17 = std::
                                                  deque<util::variant,_std::allocator<util::variant>_>
                                                  ::operator[]((
                                                  deque<util::variant,_std::allocator<util::variant>_>
                                                  *)(function_name.field_2._8_8_ + 0x138),1);
                                                  local_644 = util::variant::operator_cast_to_int
                                                                        (pvVar17);
                                                  std::__cxx11::string::string
                                                            ((string *)&local_668,
                                                             (string *)local_640);
                                                  local_68c.value = local_644;
                                                  std::function<int(int)>::
                                                  function<Quest_Context::DoAction(EOPlus::Action_const&)::__0,void>
                                                            ((function<int(int)> *)&local_688,
                                                             &local_68c);
                                                  bVar4 = modify_stat(&local_668,&local_688,
                                                                      this->character);
                                                  std::function<int_(int)>::~function(&local_688);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_668);
                                                  if (((bVar4 ^ 0xffU) & 1) != 0) {
                                                    stat_1.field_2._M_local_buf[0xf] = '\x01';
                                                    pRVar16 = (Runtime_Error *)
                                                              __cxa_allocate_exception(0x10);
                                                    std::operator+(&local_6b0,"Unknown stat: ",
                                                                   (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_640);
                                                  EOPlus::Runtime_Error::Runtime_Error
                                                            (pRVar16,&local_6b0);
                                                  stat_1.field_2._M_local_buf[0xf] = '\0';
                                                  __cxa_throw(pRVar16,&EOPlus::Runtime_Error::
                                                                       typeinfo,
                                                              EOPlus::Runtime_Error::~Runtime_Error)
                                                  ;
                                                  }
                                                  std::__cxx11::string::~string((string *)local_640)
                                                  ;
                                                }
                                                else {
                                                  bVar4 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_40,"givestat");
                                                  if (bVar4) {
                                                    pvVar17 = std::
                                                  deque<util::variant,_std::allocator<util::variant>_>
                                                  ::operator[]((
                                                  deque<util::variant,_std::allocator<util::variant>_>
                                                  *)(function_name.field_2._8_8_ + 0x138),0);
                                                  util::variant::operator_cast_to_string
                                                            ((string *)local_6d8,pvVar17);
                                                  pvVar17 = std::
                                                  deque<util::variant,_std::allocator<util::variant>_>
                                                  ::operator[]((
                                                  deque<util::variant,_std::allocator<util::variant>_>
                                                  *)(function_name.field_2._8_8_ + 0x138),1);
                                                  local_6dc = util::variant::operator_cast_to_int
                                                                        (pvVar17);
                                                  std::__cxx11::string::string
                                                            ((string *)&local_700,
                                                             (string *)local_6d8);
                                                  local_724.value = local_6dc;
                                                  std::function<int(int)>::
                                                  function<Quest_Context::DoAction(EOPlus::Action_const&)::__1,void>
                                                            ((function<int(int)> *)&local_720,
                                                             &local_724);
                                                  bVar4 = modify_stat(&local_700,&local_720,
                                                                      this->character);
                                                  std::function<int_(int)>::~function(&local_720);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_700);
                                                  if (((bVar4 ^ 0xffU) & 1) != 0) {
                                                    stat_2.field_2._M_local_buf[0xf] = '\x01';
                                                    pRVar16 = (Runtime_Error *)
                                                              __cxa_allocate_exception(0x10);
                                                    std::operator+(&local_748,"Unknown stat: ",
                                                                   (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_6d8);
                                                  EOPlus::Runtime_Error::Runtime_Error
                                                            (pRVar16,&local_748);
                                                  stat_2.field_2._M_local_buf[0xf] = '\0';
                                                  __cxa_throw(pRVar16,&EOPlus::Runtime_Error::
                                                                       typeinfo,
                                                              EOPlus::Runtime_Error::~Runtime_Error)
                                                  ;
                                                  }
                                                  std::__cxx11::string::~string((string *)local_6d8)
                                                  ;
                                                  }
                                                  else {
                                                    bVar4 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_40,"removestat");
                                                  if (bVar4) {
                                                    pvVar17 = std::
                                                  deque<util::variant,_std::allocator<util::variant>_>
                                                  ::operator[]((
                                                  deque<util::variant,_std::allocator<util::variant>_>
                                                  *)(function_name.field_2._8_8_ + 0x138),0);
                                                  util::variant::operator_cast_to_string
                                                            ((string *)local_770,pvVar17);
                                                  pvVar17 = std::
                                                  deque<util::variant,_std::allocator<util::variant>_>
                                                  ::operator[]((
                                                  deque<util::variant,_std::allocator<util::variant>_>
                                                  *)(function_name.field_2._8_8_ + 0x138),1);
                                                  local_774 = util::variant::operator_cast_to_int
                                                                        (pvVar17);
                                                  std::__cxx11::string::string
                                                            ((string *)&local_798,
                                                             (string *)local_770);
                                                  local_7bc.value = local_774;
                                                  std::function<int(int)>::
                                                  function<Quest_Context::DoAction(EOPlus::Action_const&)::__2,void>
                                                            ((function<int(int)> *)&local_7b8,
                                                             &local_7bc);
                                                  bVar4 = modify_stat(&local_798,&local_7b8,
                                                                      this->character);
                                                  std::function<int_(int)>::~function(&local_7b8);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_798);
                                                  if (((bVar4 ^ 0xffU) & 1) != 0) {
                                                    local_7e1 = 1;
                                                    pRVar16 = (Runtime_Error *)
                                                              __cxa_allocate_exception(0x10);
                                                    std::operator+(&local_7e0,"Unknown stat: ",
                                                                   (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_770);
                                                  EOPlus::Runtime_Error::Runtime_Error
                                                            (pRVar16,&local_7e0);
                                                  local_7e1 = 0;
                                                  __cxa_throw(pRVar16,&EOPlus::Runtime_Error::
                                                                       typeinfo,
                                                              EOPlus::Runtime_Error::~Runtime_Error)
                                                  ;
                                                  }
                                                  std::__cxx11::string::~string((string *)local_770)
                                                  ;
                                                  }
                                                  else {
                                                    bVar4 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_40,"roll");
                                                  if (bVar4) {
                                                    pvVar17 = std::
                                                  deque<util::variant,_std::allocator<util::variant>_>
                                                  ::operator[]((
                                                  deque<util::variant,_std::allocator<util::variant>_>
                                                  *)(function_name.field_2._8_8_ + 0x138),0);
                                                  util::variant::operator_cast_to_int(pvVar17);
                                                  iVar7 = util::rand();
                                                  std::allocator<char>::allocator();
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)&local_808,"r",&local_809);
                                                  pmVar18 = std::
                                                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short>_>_>
                                                  ::operator[](&this->progress,&local_808);
                                                  *pmVar18 = (mapped_type)iVar7;
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_808);
                                                  std::allocator<char>::~allocator(&local_809);
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
                goto LAB_0020c133;
              }
              state_1.field_2._12_2_ = Quest::ID(this->quest);
              pvVar17 = std::deque<util::variant,_std::allocator<util::variant>_>::operator[]
                                  ((deque<util::variant,_std::allocator<util::variant>_> *)
                                   (function_name.field_2._8_8_ + 0x138),0);
              iVar7 = util::variant::operator_cast_to_int(pvVar17);
              state_1.field_2._10_2_ = (undefined2)iVar7;
              pvVar17 = std::deque<util::variant,_std::allocator<util::variant>_>::operator[]
                                  ((deque<util::variant,_std::allocator<util::variant>_> *)
                                   (function_name.field_2._8_8_ + 0x138),1);
              util::variant::operator_cast_to_string((string *)&quest_1,pvVar17);
              Character::GetQuest((Character *)local_2e8,(short)this->character);
              this_01 = std::__shared_ptr<Quest_Context,_(__gnu_cxx::_Lock_policy)2>::get
                                  ((__shared_ptr<Quest_Context,_(__gnu_cxx::_Lock_policy)2> *)
                                   local_2e8);
              std::shared_ptr<Quest_Context>::~shared_ptr((shared_ptr<Quest_Context> *)local_2e8);
              local_2e8._16_8_ = this_01;
              if ((this_01 == (element_type *)0x0) ||
                 (EOPlus::Context::SetState(&this_01->super_Context,(string *)&quest_1,true),
                 state_1.field_2._10_2_ != state_1.field_2._12_2_)) {
                local_94 = 0;
              }
              else {
                this_local._7_1_ = 1;
                local_94 = 1;
              }
              std::__cxx11::string::~string((string *)&quest_1);
            }
            if (local_94 != 0) goto LAB_0020c149;
          }
LAB_0020c133:
          this_local._7_1_ = 0;
          local_94 = 1;
        }
      }
    }
  }
LAB_0020c149:
  std::__cxx11::string::~string((string *)local_40);
LAB_0020c15f:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool Quest_Context::DoAction(const EOPlus::Action& action)
{
	if (this->quest->Disabled())
		return false;

	std::string function_name = action.expr.function;

	if (function_name == "setstate")
	{
		std::string state = util::lowercase(action.expr.args[0]);
		this->SetState(state);
		return true;
	}
	else if (function_name == "reset")
	{
		if (this->progress.find("c") == this->progress.end())
		{
			this->character->ResetQuest(this->quest->ID());
		}
		else
		{
			this->SetState("done");
		}

		return true;
		// *this may not be valid after this point
	}
	else if (function_name == "resetdaily")
	{
		this->progress["d"] = quest_day();
		++this->progress["c"];
		this->SetState("done");
		return true;
	}
	else if (function_name == "end")
	{
		this->SetState("end");
		return true;
	}
	else if (function_name == "startquest")
	{
		short id = int(action.expr.args[0]);

		auto context = character->GetQuest(id);

		if (!context)
		{
			auto it = this->character->world->quests.find(id);

			if (it != this->character->world->quests.end())
			{
				// WARNING: holds a non-tracked reference to shared_ptr
				Quest* quest = it->second.get();
				auto context = std::make_shared<Quest_Context>(this->character, quest);
				this->character->quests[it->first] = context;
				context->SetState(action.expr.args.size() >= 2 ? std::string(action.expr.args[1]) : "begin");
			}
		}
		else if (context->StateName() == "done")
		{
			context->SetState(action.expr.args.size() >= 2 ? std::string(action.expr.args[1]) : "begin");
		}
	}
	else if (function_name == "resetquest")
	{
		short this_id = this->quest->ID();
		short id = int(action.expr.args[0]);

		auto context = this->character->GetQuest(id);

		if (context)
		{
			if (this->progress.find("c") == this->progress.end())
				context->SetState("done");
			else
				this->character->ResetQuest(id);
		}

		if (id == this_id)
		{
			return true;
			// *this is not valid after this point
		}
	}
	else if (function_name == "setqueststate")
	{
		short this_id = this->quest->ID();
		short id = int(action.expr.args[0]);
		std::string state = std::string(action.expr.args[1]);

		// WARNING: holds a non-tracked reference to shared_ptr
		Quest_Context* quest = this->character->GetQuest(id).get();

		if (quest)
		{
			quest->SetState(state);

			if (id == this_id)
				return true;
		}
	}
	else if (function_name == "showhint")
	{
		this->character->StatusMsg(action.expr.args[0]);
	}
	else if (function_name == "quake")
	{
		int strength = 5;

		if (action.expr.args.size() >= 1)
			strength = std::max(1, std::min(8, int(action.expr.args[0])));

		this->character->map->Effect(MAP_EFFECT_QUAKE, strength);
	}
	else if (function_name == "quakeworld")
	{
		int strength = 5;

		if (action.expr.args.size() >= 1)
			strength = std::max(1, std::min(8, int(action.expr.args[0])));

		UTIL_FOREACH(this->character->world->maps, map)
		{
			if (map->exists)
				map->Effect(MAP_EFFECT_QUAKE, strength);
		}
	}
	else if (function_name == "setmap" || function_name == "setcoord")
	{
		this->character->Warp(int(action.expr.args[0]), int(action.expr.args[1]), int(action.expr.args[2]));
	}
	else if (function_name == "playsound")
	{
		this->character->PlaySound(int(action.expr.args[0]));
	}
	else if (function_name == "giveexp")
	{
		bool level_up = false;

		this->character->exp += int(action.expr.args[0]);

		this->character->exp = std::min(this->character->exp, int(this->character->map->world->config["MaxExp"]));

		while (this->character->level < int(this->character->map->world->config["MaxLevel"])
		 && this->character->exp >= this->character->map->world->exp_table[this->character->level+1])
		{
			level_up = true;
			++this->character->level;
			this->character->statpoints += int(this->character->map->world->config["StatPerLevel"]);
			this->character->skillpoints += int(this->character->map->world->config["SkillPerLevel"]);
			this->character->CalculateStats();
		}

		PacketBuilder builder(PACKET_RECOVER, PACKET_REPLY, 11);
		builder.AddInt(this->character->exp);
		builder.AddShort(this->character->karma);
		builder.AddChar(level_up ? this->character->level : 0);

		if (level_up)
		{
			builder.AddShort(this->character->statpoints);
			builder.AddShort(this->character->skillpoints);
		}

		this->character->Send(builder);

		if (level_up)
		{
			UTIL_FOREACH(this->character->map->characters, character)
			{
				if (character != this->character && this->character->InRange(character))
				{
					PacketBuilder builder(PACKET_ITEM, PACKET_ACCEPT, 2);
					builder.AddShort(character->PlayerID());
					character->Send(builder);
				}
			}
		}
	}
	else if (function_name == "giveitem")
	{
		int id = int(action.expr.args[0]);
		int amount = (action.expr.args.size() >= 2) ? int(action.expr.args[1]) : 1;

		if (this->character->AddItem(id, amount))
		{
			if (id == 1)
			{
				PacketBuilder builder(PACKET_ITEM, PACKET_GET, 9);
				builder.AddShort(0); // UID
				builder.AddShort(id);
				builder.AddThree(amount);
				builder.AddChar(this->character->weight);
				builder.AddChar(this->character->maxweight);
				this->character->Send(builder);
			}
			else
			{
				PacketBuilder builder(PACKET_ITEM, PACKET_OBTAIN, 6);
				builder.AddShort(id);
				builder.AddThree(amount);
				builder.AddChar(this->character->weight);
				this->character->Send(builder);
			}
		}
	}
	else if (function_name == "removeitem")
	{
		int id = int(action.expr.args[0]);
		int amount = (action.expr.args.size() >= 2) ? int(action.expr.args[1]) : 1;

		if (this->character->DelItem(id, amount))
		{
			PacketBuilder builder(PACKET_ITEM, PACKET_KICK, 7);
			builder.AddShort(id);
			builder.AddInt(this->character->HasItem(id));
			builder.AddChar(this->character->weight);
			this->character->Send(builder);
		}
	}
	else if (function_name == "setclass")
	{
		this->character->clas = int(action.expr.args[0]);

		this->character->CalculateStats();

		PacketBuilder builder(PACKET_RECOVER, PACKET_LIST, 32);

		builder.AddShort(this->character->clas);
		builder.AddShort(this->character->display_str);
		builder.AddShort(this->character->display_intl);
		builder.AddShort(this->character->display_wis);
		builder.AddShort(this->character->display_agi);
		builder.AddShort(this->character->display_con);
		builder.AddShort(this->character->display_cha);
		builder.AddShort(this->character->maxhp);
		builder.AddShort(this->character->maxtp);
		builder.AddShort(this->character->maxsp);
		builder.AddShort(this->character->maxweight);
		builder.AddShort(this->character->mindam);
		builder.AddShort(this->character->maxdam);
		builder.AddShort(this->character->accuracy);
		builder.AddShort(this->character->evade);
		builder.AddShort(this->character->armor);

		this->character->Send(builder);
	}
	else if (function_name == "setrace")
	{
		this->character->race = Skin(int(action.expr.args[0]));
		this->character->Warp(this->character->map->id, this->character->x, this->character->y);
	}
	else if (function_name == "removekarma")
	{
		this->character->karma -= int(action.expr.args[0]);

		if (this->character->karma < 0)
			this->character->karma = 0;

		PacketBuilder builder(PACKET_RECOVER, PACKET_REPLY, 7);
		builder.AddInt(this->character->exp);
		builder.AddShort(this->character->karma);
		builder.AddChar(0);
		this->character->Send(builder);
	}
	else if (function_name == "givekarma")
	{
		this->character->karma += int(action.expr.args[0]);

		if (this->character->karma > 2000)
			this->character->karma = 2000;

		PacketBuilder builder(PACKET_RECOVER, PACKET_REPLY, 7);
		builder.AddInt(this->character->exp);
		builder.AddShort(this->character->karma);
		builder.AddChar(0);
		this->character->Send(builder);
	}
	else if (function_name == "settitle")
	{
		this->character->title = std::string(action.expr.args[0]);
	}
	else if (function_name == "setfiance")
	{
		this->character->fiance = std::string(action.expr.args[0]);
	}
	else if (function_name == "setpartner")
	{
		this->character->partner = std::string(action.expr.args[0]);
	}
	else if (function_name == "sethome")
	{
		this->character->home = std::string(action.expr.args[0]);
	}
	else if (function_name == "setstat")
	{
		std::string stat = action.expr.args[0];
		int value = action.expr.args[1];

		if (!modify_stat(stat, [value](int) { return value; }, this->character))
			throw EOPlus::Runtime_Error("Unknown stat: " + stat);
	}
	else if (function_name == "givestat")
	{
		std::string stat = action.expr.args[0];
		int value = action.expr.args[1];

		if (!modify_stat(stat, [value](int x) { return x + value; }, this->character))
			throw EOPlus::Runtime_Error("Unknown stat: " + stat);
	}
	else if (function_name == "removestat")
	{
		std::string stat = action.expr.args[0];
		int value = action.expr.args[1];

		if (!modify_stat(stat, [value](int x) { return x - value; }, this->character))
			throw EOPlus::Runtime_Error("Unknown stat: " + stat);
	}
	else if (function_name == "roll")
	{
		this->progress["r"] = util::rand(1, int(action.expr.args[0]));
	}

	return false;
}